

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_readNCount_body_bmi2
                 (short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                 size_t hbSize)

{
  uint *puVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  BYTE *istart;
  uint *puVar18;
  bool bVar19;
  char buffer [8];
  undefined8 local_38;
  
  if (hbSize < 8) {
    local_38 = 0;
    memcpy(&local_38,headerBuffer,hbSize);
    sVar3 = FSE_readNCount_bmi2(normalizedCounter,maxSVPtr,tableLogPtr,&local_38,8,0);
    sVar4 = 0xffffffffffffffec;
    if (sVar3 <= hbSize) {
      sVar4 = sVar3;
    }
    if (0xffffffffffffff88 < sVar3) {
      sVar4 = sVar3;
    }
  }
  else {
    uVar7 = *maxSVPtr + 1;
    memset(normalizedCounter,0,(ulong)uVar7 * 2);
    uVar9 = *headerBuffer & 0xf;
    sVar4 = 0xffffffffffffffd4;
    if (uVar9 < 0xb) {
      uVar14 = *headerBuffer >> 4;
      *tableLogPtr = uVar9 + 5;
      iVar13 = 0x20 << uVar9;
      iVar5 = iVar13 + 1;
      iVar10 = uVar9 + 6;
      puVar1 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar18 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar19 = true;
      uVar9 = 4;
      uVar6 = 0;
      puVar8 = (uint *)headerBuffer;
      do {
        if (!bVar19) {
          uVar2 = 0;
          for (uVar11 = ~uVar14; (uVar11 & 1) == 0; uVar11 = (uVar11 | 0x80000000) >> 1) {
            uVar2 = uVar2 + 1;
          }
          while (0x17 < uVar2) {
            if (puVar1 < puVar8) {
              uVar9 = uVar9 + ((int)puVar8 - (int)puVar1) * 8 & 0x1f;
              puVar8 = puVar18;
            }
            else {
              puVar8 = (uint *)((long)puVar8 + 3);
            }
            uVar14 = *puVar8 >> uVar9;
            uVar2 = 0;
            for (uVar11 = ~uVar14; (uVar11 & 1) == 0; uVar11 = (uVar11 | 0x80000000) >> 1) {
              uVar2 = uVar2 + 1;
            }
            uVar6 = uVar6 + 0x24;
          }
          uVar6 = (uVar14 >> (uVar2 & 0x1e) & 3) + (uVar2 >> 1) * 3 + uVar6;
          uVar14 = uVar9 + (uVar2 & 0xfffffffe) + 2;
          if (uVar7 <= uVar6) {
LAB_0013caf2:
            if (iVar5 != 1) {
              return 0xffffffffffffffec;
            }
            if (uVar7 < uVar6) {
              return 0xffffffffffffffd0;
            }
            if (0x20 < (int)uVar14) {
              return 0xffffffffffffffec;
            }
            *maxSVPtr = uVar6 - 1;
            return (long)puVar8 + ((long)((int)(uVar14 + 7) >> 3) - (long)headerBuffer);
          }
          if ((puVar1 < puVar8) && (puVar18 < (uint *)((long)puVar8 + (ulong)(uVar14 >> 3)))) {
            uVar9 = uVar14 + ((int)puVar8 - (int)puVar18) * 8 & 0x1f;
            puVar8 = puVar18;
          }
          else {
            uVar9 = uVar14 & 7;
            puVar8 = (uint *)((long)puVar8 + (ulong)(uVar14 >> 3));
          }
          uVar14 = *puVar8 >> uVar9;
        }
        uVar2 = iVar13 * 2 - 1;
        uVar16 = uVar2 - iVar5;
        uVar11 = iVar13 - 1U & uVar14;
        if (uVar11 < uVar16) {
          iVar17 = iVar10 + -1;
        }
        else {
          uVar14 = uVar14 & uVar2;
          if ((int)uVar14 < iVar13) {
            uVar16 = 0;
          }
          uVar11 = uVar14 - uVar16;
          iVar17 = iVar10;
        }
        uVar14 = iVar17 + uVar9;
        iVar17 = uVar11 - 1;
        iVar15 = 1 - uVar11;
        if ((int)uVar11 < 1) {
          iVar15 = iVar17;
        }
        iVar5 = iVar5 + iVar15;
        uVar12 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        normalizedCounter[uVar12] = (short)iVar17;
        bVar19 = iVar17 != 0;
        if (iVar5 < iVar13) {
          if (iVar5 < 2) goto LAB_0013caf2;
          iVar10 = 0x20 - LZCOUNT(iVar5);
          iVar13 = 1 << ((byte)~(byte)LZCOUNT(iVar5) & 0x1f);
        }
        if (uVar7 <= uVar6) goto LAB_0013caf2;
        if ((puVar1 < puVar8) && (puVar18 < (uint *)((long)puVar8 + (long)((int)uVar14 >> 3)))) {
          uVar9 = uVar14 + ((int)puVar8 - (int)puVar18) * 8 & 0x1f;
          puVar8 = puVar18;
        }
        else {
          uVar9 = uVar14 & 7;
          puVar8 = (uint *)((long)puVar8 + (long)((int)uVar14 >> 3));
        }
        uVar14 = *puVar8 >> uVar9;
      } while( true );
    }
  }
  return sVar4;
}

Assistant:

BMI2_TARGET_ATTRIBUTE static size_t FSE_readNCount_body_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize)
{
    return FSE_readNCount_body(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}